

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O3

bool spvtools::opt::anon_unknown_7::ReplaceCubeFaceCoord
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  TypeManager *this;
  ConstantManager *this_00;
  IRContext *pIVar1;
  Analysis AVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Type *type;
  FeatureManager *pFVar8;
  Constant *c;
  Instruction *pIVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  Instruction *pIVar12;
  Instruction *pIVar13;
  Instruction *this_01;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  InstructionBuilder ir_builder;
  OperandList new_operands;
  InstructionBuilder local_128;
  Instruction *local_108;
  Instruction *local_100;
  undefined1 local_f8 [24];
  uint local_e0 [2];
  uint *local_d8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_d0;
  IRContext *local_c8;
  Instruction *local_c0;
  uint32_t local_b8;
  uint32_t local_b4;
  Instruction *local_b0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_a8;
  Instruction *local_88;
  Instruction *local_80;
  Instruction *local_78;
  Instruction *local_70;
  Instruction *local_68;
  ulong local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  AVar2 = ctx->valid_analyses_;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(ctx);
    AVar2 = ctx->valid_analyses_;
  }
  this = (ctx->type_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar2 >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(ctx);
  }
  this_00 = (ctx->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  uVar3 = analysis::TypeManager::GetFloatTypeId(this);
  type = analysis::TypeManager::GetFloatVectorType(this,2);
  local_b4 = analysis::TypeManager::GetId(this,type);
  uVar4 = analysis::TypeManager::GetBoolTypeId(this);
  local_128.parent_ = IRContext::get_instr_block(ctx,inst);
  local_128.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  uVar17 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar17 = (uint)inst->has_result_id_;
  }
  local_128.context_ = ctx;
  local_128.insert_before_.super_iterator.node_ = (iterator)(iterator)inst;
  uVar5 = Instruction::GetSingleWordOperand(inst,uVar17 + 2);
  pFVar8 = (ctx->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar8 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(ctx);
    pFVar8 = (ctx->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  uVar7 = pFVar8->extinst_importid_GLSLstd450_;
  local_c8 = ctx;
  if (uVar7 == 0) {
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"GLSL.std.450","");
    IRContext::AddExtInstImport(local_c8,(string *)local_f8);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    pIVar1 = local_c8;
    pFVar8 = (local_c8->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (pFVar8 == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(local_c8);
      pFVar8 = (pIVar1->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    uVar7 = pFVar8->extinst_importid_GLSLstd450_;
  }
  uVar6 = analysis::ConstantManager::GetFloatConstId(this_00,0.0);
  local_108 = (Instruction *)CONCAT44(local_108._4_4_,uVar6);
  local_b8 = analysis::ConstantManager::GetFloatConstId(this_00,2.0);
  uVar6 = analysis::ConstantManager::GetFloatConstId(this_00,0.5);
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (_func_int **)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = operator_new(8);
  local_f8._8_8_ = local_f8._0_8_ + 8;
  *(ulong *)local_f8._0_8_ = CONCAT44(uVar6,uVar6);
  local_f8._16_8_ = local_f8._8_8_;
  c = analysis::ConstantManager::GetConstant
                (this_00,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  uVar17 = 0;
  pIVar9 = analysis::ConstantManager::GetDefiningInstruction(this_00,c,0,(inst_iterator *)0x0);
  if (pIVar9->has_result_id_ == true) {
    uVar17 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  local_60 = (ulong)uVar17;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (_func_int **)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = operator_new(4);
  local_f8._8_8_ = local_f8._0_8_ + 4;
  *(char *)(local_f8._0_8_ + 0) = '\0';
  *(char *)(local_f8._0_8_ + 1) = '\0';
  *(char *)(local_f8._0_8_ + 2) = '\0';
  *(char *)(local_f8._0_8_ + 3) = '\0';
  local_f8._16_8_ = local_f8._8_8_;
  pIVar9 = InstructionBuilder::AddCompositeExtract
                     (&local_128,uVar3,uVar5,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (_func_int **)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = operator_new(4);
  local_f8._8_8_ = local_f8._0_8_ + 4;
  *(char *)(local_f8._0_8_ + 0) = '\x01';
  *(char *)(local_f8._0_8_ + 1) = '\0';
  *(char *)(local_f8._0_8_ + 2) = '\0';
  *(char *)(local_f8._0_8_ + 3) = '\0';
  local_f8._16_8_ = local_f8._8_8_;
  pIVar10 = InstructionBuilder::AddCompositeExtract
                      (&local_128,uVar3,uVar5,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (_func_int **)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = operator_new(4);
  local_f8._8_8_ = local_f8._0_8_ + 4;
  *(char *)(local_f8._0_8_ + 0) = '\x02';
  *(char *)(local_f8._0_8_ + 1) = '\0';
  *(char *)(local_f8._0_8_ + 2) = '\0';
  *(char *)(local_f8._0_8_ + 3) = '\0';
  local_f8._16_8_ = local_f8._8_8_;
  pIVar11 = InstructionBuilder::AddCompositeExtract
                      (&local_128,uVar3,uVar5,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  uVar6 = 0;
  uVar5 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  local_70 = InstructionBuilder::AddUnaryOp(&local_128,uVar3,OpFNegate,uVar5);
  if (pIVar10->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  local_68 = InstructionBuilder::AddUnaryOp(&local_128,uVar3,OpFNegate,uVar6);
  uVar6 = 0;
  uVar5 = 0;
  if (pIVar11->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
  }
  local_c0 = InstructionBuilder::AddUnaryOp(&local_128,uVar3,OpFNegate,uVar5);
  if (pIVar9->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (_func_int **)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = operator_new(4);
  local_f8._8_8_ = local_f8._0_8_ + 4;
  *(uint32_t *)local_f8._0_8_ = uVar6;
  local_f8._16_8_ = local_f8._8_8_;
  local_b0 = InstructionBuilder::AddNaryExtendedInstruction
                       (&local_128,uVar3,uVar7,4,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((uint32_t *)local_f8._0_8_ != (uint32_t *)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  uVar5 = 0;
  if (pIVar10->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (_func_int **)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = operator_new(4);
  local_f8._8_8_ = local_f8._0_8_ + 4;
  *(uint32_t *)local_f8._0_8_ = uVar5;
  local_f8._16_8_ = local_f8._8_8_;
  pIVar12 = InstructionBuilder::AddNaryExtendedInstruction
                      (&local_128,uVar3,uVar7,4,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((uint32_t *)local_f8._0_8_ != (uint32_t *)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  uVar5 = 0;
  if (pIVar11->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
  }
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (_func_int **)0x0;
  local_f8._16_8_ = 0;
  local_100 = pIVar11;
  local_f8._0_8_ = operator_new(4);
  local_f8._8_8_ = local_f8._0_8_ + 4;
  *(uint32_t *)local_f8._0_8_ = uVar5;
  local_f8._16_8_ = local_f8._8_8_;
  pIVar11 = InstructionBuilder::AddNaryExtendedInstruction
                      (&local_128,uVar3,uVar7,4,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((uint32_t *)local_f8._0_8_ != (uint32_t *)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  uVar6 = 0;
  uVar5 = 0;
  if (local_100->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_100,(uint)local_100->has_type_id_);
  }
  local_88 = InstructionBuilder::AddBinaryOp
                       (&local_128,uVar4,OpFOrdLessThan,uVar5,(uint32_t)local_108);
  if (pIVar10->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  local_78 = InstructionBuilder::AddBinaryOp
                       (&local_128,uVar4,OpFOrdLessThan,uVar6,(uint32_t)local_108);
  uVar5 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  local_80 = InstructionBuilder::AddBinaryOp
                       (&local_128,uVar4,OpFOrdLessThan,uVar5,(uint32_t)local_108);
  if (local_b0->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_b0,(uint)local_b0->has_type_id_);
    uVar16 = (ulong)uVar5;
  }
  else {
    uVar16 = 0;
  }
  if (pIVar12->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
    uVar15 = (ulong)uVar5 << 0x20;
  }
  else {
    uVar15 = 0;
  }
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (_func_int **)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = operator_new(8);
  local_f8._8_8_ = local_f8._0_8_ + 8;
  *(ulong *)local_f8._0_8_ = uVar15 | uVar16;
  local_f8._16_8_ = local_f8._8_8_;
  pIVar10 = InstructionBuilder::AddNaryExtendedInstruction
                      (&local_128,uVar3,uVar7,0x28,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((ulong *)local_f8._0_8_ != (ulong *)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  local_108 = inst;
  if (pIVar11->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
    uVar16 = (ulong)uVar5;
  }
  else {
    uVar16 = 0;
  }
  if (pIVar10->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    uVar15 = (ulong)uVar5 << 0x20;
  }
  else {
    uVar15 = 0;
  }
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (_func_int **)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = operator_new(8);
  local_f8._8_8_ = local_f8._0_8_ + 8;
  *(ulong *)local_f8._0_8_ = uVar15 | uVar16;
  local_f8._16_8_ = local_f8._8_8_;
  pIVar13 = InstructionBuilder::AddNaryExtendedInstruction
                      (&local_128,uVar3,uVar7,0x28,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((ulong *)local_f8._0_8_ != (ulong *)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  uVar7 = 0;
  uVar5 = 0;
  if (pIVar13->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  pIVar13 = InstructionBuilder::AddBinaryOp(&local_128,uVar3,OpFMul,local_b8,uVar5);
  if (pIVar11->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
  }
  uVar6 = 0;
  uVar5 = 0;
  if (pIVar10->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  pIVar10 = InstructionBuilder::AddBinaryOp(&local_128,uVar4,OpFOrdGreaterThanEqual,uVar7,uVar5);
  if (pIVar10->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  pIVar11 = InstructionBuilder::AddUnaryOp(&local_128,uVar4,OpLogicalNot,uVar6);
  uVar7 = 0;
  uVar5 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  if (local_b0->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(local_b0,(uint)local_b0->has_type_id_);
  }
  pIVar12 = InstructionBuilder::AddBinaryOp(&local_128,uVar4,OpFOrdGreaterThanEqual,uVar5,uVar7);
  uVar7 = 0;
  uVar5 = 0;
  if (pIVar11->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
  }
  if (pIVar12->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  pIVar11 = InstructionBuilder::AddBinaryOp(&local_128,uVar4,OpLogicalAnd,uVar5,uVar7);
  uVar5 = 0;
  uVar4 = 0;
  if (local_88->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(local_88,(uint)local_88->has_type_id_);
  }
  if (local_70->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_70,(uint)local_70->has_type_id_);
  }
  uVar6 = 0;
  uVar7 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  pIVar12 = InstructionBuilder::AddSelect(&local_128,uVar3,uVar4,uVar5,uVar7);
  if (local_80->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(local_80,(uint)local_80->has_type_id_);
  }
  uVar5 = 0;
  uVar4 = 0;
  if (local_100->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(local_100,(uint)local_100->has_type_id_);
  }
  if (local_c0->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_c0,(uint)local_c0->has_type_id_);
  }
  this_01 = InstructionBuilder::AddSelect(&local_128,uVar3,uVar6,uVar4,uVar5);
  uVar5 = 0;
  uVar4 = 0;
  if (pIVar11->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
  }
  if (pIVar9->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  uVar6 = 0;
  uVar7 = 0;
  if (this_01->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  pIVar9 = InstructionBuilder::AddSelect(&local_128,uVar3,uVar4,uVar5,uVar7);
  if (pIVar10->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  pIVar10 = local_108;
  uVar5 = 0;
  uVar4 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  if (pIVar9->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  pIVar9 = InstructionBuilder::AddSelect(&local_128,uVar3,uVar6,uVar4,uVar5);
  uVar5 = 0;
  uVar4 = 0;
  if (local_78->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(local_78,(uint)local_78->has_type_id_);
  }
  if (local_c0->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_c0,(uint)local_c0->has_type_id_);
  }
  uVar6 = 0;
  uVar7 = 0;
  if (local_100->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(local_100,(uint)local_100->has_type_id_);
  }
  pIVar12 = InstructionBuilder::AddSelect(&local_128,uVar3,uVar4,uVar5,uVar7);
  if (pIVar11->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
  }
  uVar5 = 0;
  uVar4 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  if (local_68->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_68,(uint)local_68->has_type_id_);
  }
  pIVar11 = InstructionBuilder::AddSelect(&local_128,uVar3,uVar6,uVar4,uVar5);
  uVar3 = local_b4;
  if (pIVar9->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
    uVar16 = (ulong)uVar4;
  }
  else {
    uVar16 = 0;
  }
  if (pIVar11->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
    uVar15 = (ulong)uVar4 << 0x20;
  }
  else {
    uVar15 = 0;
  }
  local_f8._0_8_ = operator_new(8);
  local_f8._8_8_ = local_f8._0_8_ + 8;
  *(ulong *)local_f8._0_8_ = uVar15 | uVar16;
  local_f8._16_8_ = local_f8._8_8_;
  pIVar9 = InstructionBuilder::AddCompositeConstruct
                     (&local_128,uVar3,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((ulong *)local_f8._0_8_ != (ulong *)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  bVar14 = pIVar13->has_result_id_;
  if ((bool)bVar14 == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
    bVar14 = pIVar13->has_result_id_;
    uVar16 = (ulong)uVar4;
  }
  else {
    uVar16 = 0;
  }
  if ((bVar14 & 1) == 0) {
    uVar15 = 0;
  }
  else {
    uVar4 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
    uVar15 = (ulong)uVar4 << 0x20;
  }
  local_f8._0_8_ = operator_new(8);
  local_f8._8_8_ = local_f8._0_8_ + 8;
  *(ulong *)local_f8._0_8_ = uVar15 | uVar16;
  local_f8._16_8_ = local_f8._8_8_;
  pIVar11 = InstructionBuilder::AddCompositeConstruct
                      (&local_128,uVar3,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if ((ulong *)local_f8._0_8_ != (ulong *)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  uVar5 = 0;
  uVar4 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  if (pIVar11->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
  }
  pIVar9 = InstructionBuilder::AddBinaryOp(&local_128,uVar3,OpFDiv,uVar4,uVar5);
  pIVar10->opcode_ = OpFAdd;
  local_a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  if (pIVar9->has_result_id_ == true) {
    local_58._16_4_ = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  local_58._0_8_ = &PTR__SmallVector_00b02ef8;
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._8_8_ = 1;
  local_f8._0_4_ = 1;
  local_f8._8_8_ = &PTR__SmallVector_00b02ef8;
  local_f8._16_8_ = 0;
  local_d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_d8 = local_e0;
  local_58._24_8_ = local_58 + 0x10;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_f8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_a8,(Operand *)local_f8);
  local_f8._8_8_ = &PTR__SmallVector_00b02ef8;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_d0,local_d0._M_head_impl);
  }
  local_d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_38,local_38._M_head_impl);
  }
  local_58._0_8_ = &PTR__SmallVector_00b02ef8;
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._16_4_ = (undefined4)local_60;
  local_58._8_8_ = 1;
  local_f8._0_4_ = 1;
  local_f8._8_8_ = &PTR__SmallVector_00b02ef8;
  local_f8._16_8_ = 0;
  local_d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_d8 = local_e0;
  local_58._24_8_ = local_58 + 0x10;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_f8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_a8,(Operand *)local_f8);
  local_f8._8_8_ = &PTR__SmallVector_00b02ef8;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_d0,local_d0._M_head_impl);
  }
  pIVar1 = local_c8;
  local_d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_38,local_38._M_head_impl);
  }
  uVar17 = (pIVar10->has_result_id_ & 1) + 1;
  if (pIVar10->has_type_id_ == false) {
    uVar17 = (uint)pIVar10->has_result_id_;
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
            (&pIVar10->operands_,
             (Operand *)
             ((long)((((pIVar10->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                    0xfffffffffffffffa) + (ulong)(uVar17 * 0x30)),
             (pIVar10->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
             &pIVar10->operands_,
             (pIVar10->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             local_a8.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_a8.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::UpdateDefUse
              ((pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               pIVar10);
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_a8);
  return true;
}

Assistant:

bool ReplaceCubeFaceCoord(IRContext* ctx, Instruction* inst,
                          const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = ctx->get_type_mgr();
  analysis::ConstantManager* const_mgr = ctx->get_constant_mgr();

  uint32_t float_type_id = type_mgr->GetFloatTypeId();
  const analysis::Type* v2_float_type = type_mgr->GetFloatVectorType(2);
  uint32_t v2_float_type_id = type_mgr->GetId(v2_float_type);
  uint32_t bool_id = type_mgr->GetBoolTypeId();

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t input_id = inst->GetSingleWordInOperand(2);
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  // Get the constants that will be used.
  uint32_t f0_const_id = const_mgr->GetFloatConstId(0.0);
  uint32_t f2_const_id = const_mgr->GetFloatConstId(2.0);
  uint32_t f0_5_const_id = const_mgr->GetFloatConstId(0.5);
  const analysis::Constant* vec_const =
      const_mgr->GetConstant(v2_float_type, {f0_5_const_id, f0_5_const_id});
  uint32_t vec_const_id =
      const_mgr->GetDefiningInstruction(vec_const)->result_id();

  // Extract the input values.
  Instruction* x = ir_builder.AddCompositeExtract(float_type_id, input_id, {0});
  Instruction* y = ir_builder.AddCompositeExtract(float_type_id, input_id, {1});
  Instruction* z = ir_builder.AddCompositeExtract(float_type_id, input_id, {2});

  // Negate the input values.
  Instruction* nx =
      ir_builder.AddUnaryOp(float_type_id, spv::Op::OpFNegate, x->result_id());
  Instruction* ny =
      ir_builder.AddUnaryOp(float_type_id, spv::Op::OpFNegate, y->result_id());
  Instruction* nz =
      ir_builder.AddUnaryOp(float_type_id, spv::Op::OpFNegate, z->result_id());

  // Get the abolsute values of the inputs.
  Instruction* ax = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {x->result_id()});
  Instruction* ay = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {y->result_id()});
  Instruction* az = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {z->result_id()});

  // Find which values are negative.  Used in later computations.
  Instruction* is_z_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, z->result_id(), f0_const_id);
  Instruction* is_y_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, y->result_id(), f0_const_id);
  Instruction* is_x_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, x->result_id(), f0_const_id);

  // Compute cubema
  Instruction* amax_x_y = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FMax,
      {ax->result_id(), ay->result_id()});
  Instruction* amax = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FMax,
      {az->result_id(), amax_x_y->result_id()});
  Instruction* cubema = ir_builder.AddBinaryOp(float_type_id, spv::Op::OpFMul,
                                               f2_const_id, amax->result_id());

  // Do the comparisons needed for computing cubesc and cubetc.
  Instruction* is_z_max =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             az->result_id(), amax_x_y->result_id());
  Instruction* not_is_z_max = ir_builder.AddUnaryOp(
      bool_id, spv::Op::OpLogicalNot, is_z_max->result_id());
  Instruction* y_gr_x =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             ay->result_id(), ax->result_id());
  Instruction* is_y_max =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpLogicalAnd,
                             not_is_z_max->result_id(), y_gr_x->result_id());

  // Select the correct value for cubesc.
  Instruction* cubesc_case_1 = ir_builder.AddSelect(
      float_type_id, is_z_neg->result_id(), nx->result_id(), x->result_id());
  Instruction* cubesc_case_2 = ir_builder.AddSelect(
      float_type_id, is_x_neg->result_id(), z->result_id(), nz->result_id());
  Instruction* sel =
      ir_builder.AddSelect(float_type_id, is_y_max->result_id(), x->result_id(),
                           cubesc_case_2->result_id());
  Instruction* cubesc =
      ir_builder.AddSelect(float_type_id, is_z_max->result_id(),
                           cubesc_case_1->result_id(), sel->result_id());

  // Select the correct value for cubetc.
  Instruction* cubetc_case_1 = ir_builder.AddSelect(
      float_type_id, is_y_neg->result_id(), nz->result_id(), z->result_id());
  Instruction* cubetc =
      ir_builder.AddSelect(float_type_id, is_y_max->result_id(),
                           cubetc_case_1->result_id(), ny->result_id());

  // Do the division
  Instruction* cube = ir_builder.AddCompositeConstruct(
      v2_float_type_id, {cubesc->result_id(), cubetc->result_id()});
  Instruction* denom = ir_builder.AddCompositeConstruct(
      v2_float_type_id, {cubema->result_id(), cubema->result_id()});
  Instruction* div = ir_builder.AddBinaryOp(
      v2_float_type_id, spv::Op::OpFDiv, cube->result_id(), denom->result_id());

  // Get the final result by adding 0.5 to |div|.
  inst->SetOpcode(spv::Op::OpFAdd);
  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {div->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {vec_const_id}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}